

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall Centaurus::CharClass<wchar_t>::append(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  reference pvVar4;
  Range<wchar_t> *r_local;
  CharClass<wchar_t> *this_local;
  
  bVar1 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::empty
                    (&this->m_ranges);
  if (bVar1) {
    std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
              (&this->m_ranges,r);
  }
  else {
    pvVar4 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
             back(&this->m_ranges);
    wVar2 = Range<wchar_t>::end(pvVar4);
    wVar3 = Range<wchar_t>::start(r);
    if (wVar2 == wVar3) {
      pvVar4 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
               back(&this->m_ranges);
      wVar2 = Range<wchar_t>::end(r);
      Range<wchar_t>::end(pvVar4,wVar2);
    }
    else {
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
                (&this->m_ranges,r);
    }
  }
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }